

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

size_t __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedBools::ByteSizeLong
          (TensorValue_RepeatedBools *this)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  
  uVar1 = (this->values_).current_size_;
  if ((ulong)uVar1 == 0) {
    lVar3 = 0;
  }
  else {
    lVar3 = 0x3f;
    if ((long)(int)(uVar1 | 1) != 0) {
      for (; (ulong)(long)(int)(uVar1 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    lVar3 = (ulong)((int)lVar3 * 9 + 0x49U >> 6) + 1;
  }
  sVar4 = lVar3 + (ulong)uVar1;
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar4 = sVar4 + *(long *)((uVar2 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar4;
  return sVar4;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}